

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<unsigned_long>::setCapacity(Vector<unsigned_long> *this,size_t newSize)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  RemoveConst<unsigned_long> *pRVar3;
  ulong __n;
  ArrayBuilder<unsigned_long> local_38;
  
  puVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)puVar1 >> 3)) {
    (this->builder).pos = puVar1 + newSize;
  }
  local_38.pos = (RemoveConst<unsigned_long> *)
                 _::HeapArrayDisposer::allocateImpl
                           (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  puVar1 = (this->builder).ptr;
  puVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (puVar1 != puVar2) {
    __n = (long)puVar2 - (long)puVar1 & 0xfffffffffffffff8;
    memcpy(local_38.pos,puVar1,__n);
    local_38.pos = (RemoveConst<unsigned_long> *)((long)local_38.pos + __n);
  }
  ArrayBuilder<unsigned_long>::operator=(&this->builder,&local_38);
  puVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  puVar1 = local_38.ptr;
  if (local_38.ptr != (unsigned_long *)0x0) {
    local_38.ptr = (unsigned_long *)0x0;
    local_38.pos = (RemoveConst<unsigned_long> *)0x0;
    local_38.endPtr = (unsigned_long *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,puVar1,8,(long)pRVar3 - (long)puVar1 >> 3,
               (long)puVar2 - (long)puVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }